

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall
QTreeViewPrivate::layout
          (QTreeViewPrivate *this,int i,bool recursiveExpanding,bool afterIsUninitialized)

{
  QAbstractItemModel *pQVar1;
  byte bVar2;
  bool bVar3;
  undefined1 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  QTreeViewPrivate *pQVar9;
  ulong uVar10;
  const_reference pQVar11;
  reference pQVar12;
  byte in_CL;
  byte bVar13;
  byte in_DL;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  int in_ESI;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int j;
  QTreeViewItem *item;
  int children;
  int last;
  int hidden;
  int level;
  int first;
  bool expanding;
  int lastCount;
  int viewCount;
  int itemHeight;
  int count;
  QTreeView *q;
  QModelIndex index;
  QModelIndex parent;
  QModelIndex current;
  QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_widgets_itemviews_qtreeview_cpp:3419:49)>
  resetModelIfNeeded;
  undefined4 in_stack_fffffffffffffe88;
  ItemFlag in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  QPersistentModelIndex *in_stack_fffffffffffffe98;
  QList<QTreeViewItem> *size;
  undefined5 in_stack_fffffffffffffea0;
  byte in_stack_fffffffffffffea5;
  byte in_stack_fffffffffffffea6;
  byte bVar14;
  undefined1 in_stack_fffffffffffffea7;
  QTreeViewPrivate *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  uint uVar15;
  QTreeViewPrivate *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffecc;
  int local_130;
  int local_12c;
  int local_114;
  reference local_110;
  int local_100;
  int local_f0;
  int local_e4;
  undefined2 in_stack_ffffffffffffff28;
  QPersistentModelIndex local_c8;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_c0;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_bc;
  undefined1 *local_b8;
  undefined1 *local_b0;
  QAbstractItemModel *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  qsizetype local_88;
  QPersistentModelIndex local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  QModelIndex local_60 [2];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar13 = in_DL & 1;
  bVar2 = in_CL & 1;
  pQVar9 = (QTreeViewPrivate *)q_func(in_RDI);
  local_60[0]._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_60[0].i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  local_60[0].m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::QModelIndex((QModelIndex *)0x8fa7a6);
  local_78.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  if (in_ESI < 0) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78);
  }
  else {
    modelIndex((QTreeViewPrivate *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8);
  }
  if ((in_ESI < 0) ||
     (bVar3 = QModelIndex::isValid
                        ((QModelIndex *)
                         CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)), bVar3)) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = QList<QTreeViewItem>::size(&in_RDI->viewItems);
    qScopeGuard<QTreeViewPrivate::layout(int,bool,bool)::__0>
              ((anon_class_16_2_70c45082_for_m_func *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    local_e4 = 0;
    pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
    uVar10 = (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,&local_78);
    if ((uVar10 & 1) != 0) {
      pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
      uVar10 = (**(code **)(*(long *)pQVar1 + 0x130))(pQVar1,&local_78);
      if ((uVar10 & 1) == 0) {
        pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
        local_e4 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_78);
      }
      else {
        pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
        (**(code **)(*(long *)pQVar1 + 0x128))(pQVar1,&local_78);
        if (in_RDI->defaultItemHeight < 1) {
          local_12c = (**(code **)(*(long *)&(pQVar9->super_QAbstractItemViewPrivate).
                                             super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                             super_QWidgetPrivate + 0x1f8))(pQVar9,0);
          uVar10 = extraout_RDX_00;
        }
        else {
          local_12c = in_RDI->defaultItemHeight;
          uVar10 = extraout_RDX;
        }
        if (local_12c == 0) {
          local_130 = 0;
        }
        else {
          iVar7 = QWidget::height((QWidget *)0x8fa96e);
          local_130 = iVar7 / local_12c;
          uVar10 = (long)iVar7 % (long)local_12c & 0xffffffff;
        }
        local_f0 = -1;
        while( true ) {
          pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
          local_e4 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_78,uVar10);
          uVar8 = in_stack_fffffffffffffecc & 0xffffff;
          if ((local_e4 < local_130) &&
             (uVar8 = in_stack_fffffffffffffecc & 0xffffff, local_e4 != local_f0)) {
            pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
            uVar4 = (**(code **)(*(long *)pQVar1 + 0x130))(pQVar1,&local_78);
            uVar8 = CONCAT13(uVar4,(int3)uVar8);
          }
          in_stack_fffffffffffffecc = uVar8;
          if ((in_stack_fffffffffffffecc & 0x1000000) == 0) break;
          pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
          (**(code **)(*(long *)pQVar1 + 0x128))(pQVar1,&local_78);
          uVar10 = extraout_RDX_01;
          local_f0 = local_e4;
        }
      }
    }
    bVar3 = true;
    if (in_ESI == -1) {
      if ((in_RDI->uniformRowHeights & 1U) != 0) {
        local_a0 = &DAT_aaaaaaaaaaaaaaaa;
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        local_90 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
        (**(code **)(*(long *)pQVar1 + 0x60))(&local_a0,pQVar1,0,0,&local_78);
        iVar7 = QTreeView::indexRowSizeHint
                          ((QTreeView *)
                           CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                           (QModelIndex *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        in_RDI->defaultItemHeight = iVar7;
      }
      QList<QTreeViewItem>::resize
                ((QList<QTreeViewItem> *)
                 CONCAT17(in_stack_fffffffffffffea7,
                          CONCAT16(in_stack_fffffffffffffea6,
                                   CONCAT15(in_stack_fffffffffffffea5,in_stack_fffffffffffffea0))),
                 (qsizetype)in_stack_fffffffffffffe98);
      bVar2 = 1;
    }
    else {
      QList<QTreeViewItem>::operator[]
                ((QList<QTreeViewItem> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      bVar5 = q20::cmp_not_equal<unsigned_int,int>(0,0x8fab56);
      if (bVar5) {
        if ((bVar2 & 1) == 0) {
          iVar7 = in_ESI + 1;
          QTreeViewItem::QTreeViewItem
                    ((QTreeViewItem *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))
          ;
          insertViewItems((QTreeViewPrivate *)CONCAT44(iVar7,in_stack_fffffffffffffec0),
                          (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                          (int)in_stack_fffffffffffffeb8,
                          (QTreeViewItem *)
                          CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        }
        else if (0 < local_e4) {
          in_stack_fffffffffffffeb8 = (QTreeViewPrivate *)&in_RDI->viewItems;
          QList<QTreeViewItem>::size(&in_RDI->viewItems);
          QList<QTreeViewItem>::resize
                    ((QList<QTreeViewItem> *)
                     CONCAT17(in_stack_fffffffffffffea7,
                              CONCAT16(in_stack_fffffffffffffea6,
                                       CONCAT15(in_stack_fffffffffffffea5,in_stack_fffffffffffffea0)
                                      )),(qsizetype)in_stack_fffffffffffffe98);
        }
      }
      else {
        bVar3 = false;
      }
    }
    iVar7 = in_ESI + 1;
    if (in_ESI < 0) {
      uVar8 = 0;
    }
    else {
      pQVar11 = QList<QTreeViewItem>::at
                          ((QList<QTreeViewItem> *)
                           CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      uVar8 = ((uint)((ulong)*(undefined8 *)&pQVar11->field_0x1c >> 0x20) & 0xffff) + 1;
    }
    local_100 = 0;
    local_110 = (reference)0x0;
    uVar15 = uVar8;
    for (local_114 = iVar7; local_114 < iVar7 + local_e4; local_114 = local_114 + 1) {
      pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
      (**(code **)(*(long *)pQVar1 + 0x60))(&local_b8,pQVar1,local_114 - iVar7,0,&local_78);
      local_60[0]._0_8_ = local_b8;
      local_60[0].i = (quintptr)local_b0;
      local_60[0].m.ptr = local_a8;
      bVar5 = isRowHidden(in_stack_fffffffffffffeb8,
                          (QModelIndex *)CONCAT44(uVar15,in_stack_fffffffffffffeb0));
      if (bVar5) {
        local_100 = local_100 + 1;
      }
      else {
        if (local_110 != (reference)0x0) {
          *(ulong *)&local_110->field_0x1c =
               *(ulong *)&local_110->field_0x1c & 0xfffffffffffffff7 | 8;
        }
        in_stack_fffffffffffffea8 = pQVar9;
        local_110 = QList<QTreeViewItem>::operator[]
                              ((QList<QTreeViewItem> *)
                               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        (local_110->index).r = local_60[0].r;
        (local_110->index).c = local_60[0].c;
        (local_110->index).i = local_60[0].i;
        (local_110->index).m.ptr = local_60[0].m.ptr;
        local_110->parentItem = in_ESI;
        *(ulong *)&local_110->field_0x1c =
             *(ulong *)&local_110->field_0x1c & 0xffff0000ffffffff | ((ulong)uVar8 & 0xffff) << 0x20
        ;
        *(ulong *)&local_110->field_0x1c = *(ulong *)&local_110->field_0x1c & 0xffffffffffff;
        pQVar9 = in_stack_fffffffffffffea8;
        QModelIndex::row(local_60);
        bVar5 = QTreeView::isFirstColumnSpanned
                          ((QTreeView *)CONCAT44(uVar15,in_stack_fffffffffffffeb0),
                           (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                           (QModelIndex *)
                           CONCAT17(in_stack_fffffffffffffea7,
                                    CONCAT16(in_stack_fffffffffffffea6,
                                             CONCAT15(in_stack_fffffffffffffea5,
                                                      in_stack_fffffffffffffea0))));
        *(ulong *)&local_110->field_0x1c =
             *(ulong *)&local_110->field_0x1c & 0xfffffffffffffffd | (ulong)bVar5 << 1;
        *(ulong *)&local_110->field_0x1c = *(ulong *)&local_110->field_0x1c & 0xfffffffffffffffe;
        *(ulong *)&local_110->field_0x1c = *(ulong *)&local_110->field_0x1c & 0xffffffff0000000f;
        *(ulong *)&local_110->field_0x1c = *(ulong *)&local_110->field_0x1c & 0xfffffffffffffff7;
        if ((bVar13 & 1) == 0) {
LAB_008faee4:
          in_stack_fffffffffffffea7 =
               isIndexExpanded((QTreeViewPrivate *)CONCAT44(uVar15,in_stack_fffffffffffffeb0),
                               (QModelIndex *)in_stack_fffffffffffffea8);
        }
        else {
          local_c0.super_QFlagsStorage<Qt::ItemFlag>.i =
               (QFlagsStorage<Qt::ItemFlag>)
               QModelIndex::flags((QModelIndex *)
                                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
          local_bc.super_QFlagsStorage<Qt::ItemFlag>.i =
               (QFlagsStorage<Qt::ItemFlag>)
               QFlags<Qt::ItemFlag>::operator&
                         ((QFlags<Qt::ItemFlag> *)
                          CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          in_stack_fffffffffffffe8c);
          bVar5 = QFlags<Qt::ItemFlag>::operator!((QFlags<Qt::ItemFlag> *)&local_bc);
          in_stack_fffffffffffffea7 = true;
          if (!bVar5) goto LAB_008faee4;
        }
        if ((bool)in_stack_fffffffffffffea7 == false) {
          bVar5 = hasVisibleChildren(in_stack_fffffffffffffea8,
                                     (QModelIndex *)
                                     (ulong)CONCAT16(in_stack_fffffffffffffea6,
                                                     CONCAT15(in_stack_fffffffffffffea5,
                                                              in_stack_fffffffffffffea0)));
          *(ulong *)&local_110->field_0x1c =
               *(ulong *)&local_110->field_0x1c & 0xfffffffffffffffb | (ulong)bVar5 << 2;
        }
        else {
          bVar5 = false;
          bVar14 = 0;
          if ((bVar13 & 1) != 0) {
            QPersistentModelIndex::QPersistentModelIndex(&local_c8,(QModelIndex *)local_60);
            bVar5 = true;
            bVar6 = storeExpanded((QTreeViewPrivate *)
                                  CONCAT17(in_stack_fffffffffffffea7,
                                           CONCAT16(bVar14,CONCAT15(in_stack_fffffffffffffea5,
                                                                    in_stack_fffffffffffffea0))),
                                  in_stack_fffffffffffffe98);
            bVar14 = 0;
            if (bVar6) {
              bVar6 = QObject::signalsBlocked((QObject *)0x8faf66);
              bVar14 = bVar6 ^ 0xff;
            }
          }
          in_stack_fffffffffffffea5 = bVar14;
          in_stack_fffffffffffffea6 = in_stack_fffffffffffffea5;
          if (bVar5) {
            QPersistentModelIndex::~QPersistentModelIndex(&local_c8);
          }
          if ((in_stack_fffffffffffffea5 & 1) != 0) {
            QTreeView::expanded((QTreeView *)
                                CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                (QModelIndex *)
                                CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          }
          *(ulong *)&local_110->field_0x1c =
               *(ulong *)&local_110->field_0x1c & 0xfffffffffffffffe | 1;
          layout((QTreeViewPrivate *)
                 CONCAT44(in_ESI,CONCAT13(bVar13,CONCAT12(bVar2,in_stack_ffffffffffffff28))),
                 (int)((ulong)pQVar9 >> 0x20),SUB81((ulong)pQVar9 >> 0x18,0),
                 SUB81((ulong)pQVar9 >> 0x10,0));
          local_110 = QList<QTreeViewItem>::operator[]
                                ((QList<QTreeViewItem> *)
                                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          uVar10 = *(ulong *)&local_110->field_0x1c >> 4;
          *(ulong *)&local_110->field_0x1c =
               *(ulong *)&local_110->field_0x1c & 0xfffffffffffffffb |
               (ulong)((uVar10 & 0xfffffff) != 0 && -1 < (int)((uint)uVar10 & 0xfffffff)) << 2;
        }
      }
    }
    if (0 < local_100) {
      if ((bVar2 & 1) == 0) {
        removeViewItems((QTreeViewPrivate *)CONCAT44(uVar15,in_stack_fffffffffffffeb0),
                        (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                        (int)in_stack_fffffffffffffea8);
      }
      else {
        size = &in_RDI->viewItems;
        QList<QTreeViewItem>::size(&in_RDI->viewItems);
        QList<QTreeViewItem>::resize
                  ((QList<QTreeViewItem> *)
                   CONCAT17(in_stack_fffffffffffffea7,
                            CONCAT16(in_stack_fffffffffffffea6,
                                     CONCAT15(in_stack_fffffffffffffea5,in_stack_fffffffffffffea0)))
                   ,(qsizetype)size);
      }
    }
    if (bVar3) {
      while (-1 < in_ESI) {
        in_stack_fffffffffffffe94 = local_e4 - local_100;
        pQVar12 = QList<QTreeViewItem>::operator[]
                            ((QList<QTreeViewItem> *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        *(ulong *)&pQVar12->field_0x1c =
             *(ulong *)&pQVar12->field_0x1c & 0xffffffff0000000f |
             ((ulong)(((uint)(*(ulong *)&pQVar12->field_0x1c >> 4) & 0xfffffff) +
                     in_stack_fffffffffffffe94) & 0xfffffff) << 4;
        pQVar12 = QList<QTreeViewItem>::operator[]
                            ((QList<QTreeViewItem> *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        in_ESI = pQVar12->parentItem;
      }
    }
    QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qtreeview.cpp:3419:49)>
    ::~QScopeGuard((QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_widgets_itemviews_qtreeview_cpp:3419:49)>
                    *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeViewPrivate::layout(int i, bool recursiveExpanding, bool afterIsUninitialized)
{
    Q_Q(QTreeView);
    QModelIndex current;
    QModelIndex parent = (i < 0) ? (QModelIndex)root : modelIndex(i);

    if (i>=0 && !parent.isValid()) {
        //modelIndex() should never return something invalid for the real items.
        //This can happen if columncount has been set to 0.
        //To avoid infinite loop we stop here.
        return;
    }

#if QT_CONFIG(accessibility)
    // QAccessibleTree's rowCount implementation uses viewItems.size(), so
    // we need to invalidate any cached accessibility data structures if
    // that value changes during the run of this function.
    const auto resetModelIfNeeded = qScopeGuard([oldViewItemsSize = viewItems.size(), this]{
        pendingAccessibilityUpdate |= oldViewItemsSize != viewItems.size();
    });
#endif

    int count = 0;
    if (model->hasChildren(parent)) {
        if (model->canFetchMore(parent)) {
            // fetchMore first, otherwise we might not yet have any data for sizeHintForRow
            model->fetchMore(parent);
            // guestimate the number of items in the viewport, and fetch as many as might fit
            const int itemHeight = defaultItemHeight <= 0 ? q->sizeHintForRow(0) : defaultItemHeight;
            const int viewCount = itemHeight ? viewport->height() / itemHeight : 0;
            int lastCount = -1;
            while ((count = model->rowCount(parent)) < viewCount &&
                   count != lastCount && model->canFetchMore(parent)) {
                model->fetchMore(parent);
                lastCount = count;
            }
        } else {
            count = model->rowCount(parent);
        }
    }

    bool expanding = true;
    if (i == -1) {
        if (uniformRowHeights) {
            QModelIndex index = model->index(0, 0, parent);
            defaultItemHeight = q->indexRowSizeHint(index);
        }
        viewItems.resize(count);
        afterIsUninitialized = true;
    } else if (q20::cmp_not_equal(viewItems[i].total, count)) {
        if (!afterIsUninitialized)
            insertViewItems(i + 1, count, QTreeViewItem()); // expand
        else if (count > 0)
            viewItems.resize(viewItems.size() + count);
    } else {
        expanding = false;
    }

    int first = i + 1;
    int level = (i >= 0 ? viewItems.at(i).level + 1 : 0);
    int hidden = 0;
    int last = 0;
    int children = 0;
    QTreeViewItem *item = nullptr;
    for (int j = first; j < first + count; ++j) {
        current = model->index(j - first, 0, parent);
        if (isRowHidden(current)) {
            ++hidden;
            last = j - hidden + children;
        } else {
            last = j - hidden + children;
            if (item)
                item->hasMoreSiblings = true;
            item = &viewItems[last];
            item->index = current;
            item->parentItem = i;
            item->level = level;
            item->height = 0;
            item->spanning = q->isFirstColumnSpanned(current.row(), parent);
            item->expanded = false;
            item->total = 0;
            item->hasMoreSiblings = false;
            if ((recursiveExpanding && !(current.flags() & Qt::ItemNeverHasChildren)) || isIndexExpanded(current)) {
                if (recursiveExpanding && storeExpanded(current) && !q->signalsBlocked())
                    emit q->expanded(current);
                item->expanded = true;
                layout(last, recursiveExpanding, afterIsUninitialized);
                item = &viewItems[last];
                children += item->total;
                item->hasChildren = item->total > 0;
                last = j - hidden + children;
            } else {
                item->hasChildren = hasVisibleChildren(current);
            }
        }
    }

    // remove hidden items
    if (hidden > 0) {
        if (!afterIsUninitialized)
            removeViewItems(last + 1, hidden);
        else
            viewItems.resize(viewItems.size() - hidden);
    }

    if (!expanding)
        return; // nothing changed

    while (i > -1) {
        viewItems[i].total += count - hidden;
        i = viewItems[i].parentItem;
    }
}